

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_setup_encoder(opj_j2k_t *j2k,opj_cparameters_t *parameters,opj_image_t *image)

{
  float *pfVar1;
  opj_poc_t *poVar2;
  opj_poc_t *poVar3;
  uint uVar4;
  int *__src;
  char *__s;
  opj_image_comp_t *poVar5;
  OPJ_PROG_ORDER OVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  opj_cp_t *poVar10;
  int *__dest;
  char *__dest_00;
  opj_tcp_t *poVar11;
  opj_tccp_t *poVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  float *pfVar22;
  int iVar23;
  ulong uVar24;
  float *pfVar25;
  float *pfVar26;
  opj_tccp_t *tccp;
  size_t sVar27;
  bool bVar28;
  long local_70;
  long local_68;
  
  if (image != (opj_image_t *)0x0 &&
      (parameters != (opj_cparameters_t *)0x0 && j2k != (opj_j2k_t *)0x0)) {
    poVar10 = (opj_cp_t *)calloc(1,0x90);
    j2k->cp = poVar10;
    poVar10->tw = 1;
    poVar10->th = 1;
    iVar20 = parameters->max_comp_size;
    poVar10->cinema = parameters->cp_cinema;
    poVar10->max_comp_size = iVar20;
    poVar10->rsiz = parameters->cp_rsiz;
    iVar20 = parameters->cp_fixed_alloc;
    poVar10->disto_alloc = parameters->cp_disto_alloc;
    poVar10->fixed_alloc = iVar20;
    poVar10->fixed_quality = parameters->cp_fixed_quality;
    __src = parameters->cp_matrice;
    if (__src != (int *)0x0) {
      sVar27 = (long)(parameters->tcp_numlayers * parameters->numresolution * 3) << 2;
      __dest = (int *)malloc(sVar27);
      poVar10->matrice = __dest;
      memcpy(__dest,__src,sVar27);
    }
    iVar20 = parameters->cp_tdx;
    poVar10->tdx = iVar20;
    iVar23 = parameters->cp_tdy;
    poVar10->tdy = iVar23;
    uVar21 = parameters->cp_tx0;
    poVar10->tx0 = uVar21;
    uVar4 = parameters->cp_ty0;
    poVar10->ty0 = uVar4;
    __s = parameters->cp_comment;
    if (__s != (char *)0x0) {
      sVar27 = strlen(__s);
      __dest_00 = (char *)malloc(sVar27 + 1);
      poVar10->comment = __dest_00;
      if (__dest_00 != (char *)0x0) {
        strcpy(__dest_00,__s);
      }
    }
    if (parameters->tile_size_on == 0) {
      poVar10->tdx = image->x1 - uVar21;
      poVar10->tdy = image->y1 - uVar4;
      uVar18 = 1;
      uVar19 = uVar18;
    }
    else {
      uVar19 = (long)(int)(image->x1 + iVar20 + ~uVar21) / (long)iVar20;
      poVar10->tw = (int)uVar19;
      uVar24 = (long)(int)(~uVar4 + iVar23 + image->y1) / (long)iVar23;
      uVar18 = uVar24 & 0xffffffff;
      poVar10->th = (int)uVar24;
    }
    uVar24 = uVar19 & 0xffffffff;
    if (parameters->tp_on != '\0') {
      poVar10->tp_flag = parameters->tp_flag;
      poVar10->tp_on = '\x01';
    }
    uVar14 = (ulong)image->numcomps;
    iVar20 = 0;
    for (lVar17 = 0; uVar14 * 0x38 - lVar17 != 0; lVar17 = lVar17 + 0x38) {
      poVar5 = image->comps;
      iVar20 = iVar20 + *(int *)((long)&poVar5->h + lVar17) * *(int *)((long)&poVar5->w + lVar17) *
                        *(int *)((long)&poVar5->prec + lVar17);
      poVar10->img_size = iVar20;
    }
    poVar11 = (opj_tcp_t *)calloc((long)((int)uVar18 * (int)uVar19),0x15e8);
    poVar10->tcps = poVar11;
    pfVar1 = parameters->tcp_rates;
    lVar17 = 0x144c;
    for (uVar19 = 0; (long)uVar19 < (long)((int)uVar18 * (int)uVar24); uVar19 = uVar19 + 1) {
      poVar11 = poVar10->tcps;
      uVar21 = parameters->tcp_numlayers;
      poVar11[uVar19].numlayers = uVar21;
      pfVar22 = poVar11[uVar19].rates;
      uVar18 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar18 = 0;
      }
      for (uVar24 = 0; uVar18 != uVar24; uVar24 = uVar24 + 1) {
        pfVar25 = pfVar1;
        pfVar26 = pfVar22;
        if (poVar10->cinema == OFF) {
          if (poVar10->fixed_quality != 0) {
            pfVar25 = parameters->tcp_distoratio;
            pfVar26 = poVar11[uVar19].distoratio;
          }
        }
        else if (poVar10->fixed_quality != 0) {
          *(float *)((long)poVar11->rates + uVar24 * 4 + lVar17 + -0x14) =
               parameters->tcp_distoratio[uVar24];
        }
        pfVar26[uVar24] = pfVar25[uVar24];
      }
      OVar6 = parameters->prog_order;
      poVar11[uVar19].csty = parameters->csty;
      poVar11[uVar19].prg = OVar6;
      poVar11[uVar19].mct = (int)parameters->tcp_mct;
      poVar11[uVar19].POC = 0;
      uVar21 = parameters->numpocs;
      if (uVar21 == 0) {
        iVar20 = 0;
      }
      else {
        poVar11[uVar19].POC = 1;
        uVar24 = 0;
        uVar18 = (ulong)uVar21;
        if ((int)uVar21 < 1) {
          uVar18 = uVar24;
        }
        iVar20 = 0;
        for (; uVar18 * 0x94 - uVar24 != 0; uVar24 = uVar24 + 0x94) {
          iVar23 = *(int *)(parameters->POC[0].progorder + uVar24 + 8);
          if (iVar23 == -1 || uVar19 == iVar23 - 1) {
            poVar2 = parameters->POC + iVar20;
            OVar9 = poVar2->compno0;
            OVar7 = poVar2->layno1;
            OVar8 = poVar2->resno1;
            poVar3 = poVar11[uVar19].pocs + iVar20;
            poVar3->resno0 = poVar2->resno0;
            poVar3->compno0 = OVar9;
            poVar3->layno1 = OVar7;
            poVar3->resno1 = OVar8;
            poVar11[uVar19].pocs[iVar20].compno1 = parameters->POC[iVar20].compno1;
            poVar11[uVar19].pocs[iVar20].prg1 = parameters->POC[iVar20].prg1;
            poVar11[uVar19].pocs[iVar20].tile = parameters->POC[iVar20].tile;
            iVar20 = iVar20 + 1;
          }
        }
        iVar20 = iVar20 + -1;
      }
      poVar11[uVar19].numpocs = iVar20;
      poVar12 = (opj_tccp_t *)calloc(uVar14,0x438);
      poVar11[uVar19].tccps = poVar12;
      local_70 = 0x3b0;
      local_68 = 0;
      for (uVar18 = 0; uVar18 < uVar14; uVar18 = uVar18 + 1) {
        poVar12 = poVar11[uVar19].tccps;
        uVar21 = parameters->csty & 1;
        poVar12[uVar18].csty = uVar21;
        uVar24 = (ulong)(uint)parameters->numresolution;
        poVar12[uVar18].numresolutions = parameters->numresolution;
        OVar9 = int_floorlog2(parameters->cblockw_init);
        poVar12[uVar18].cblkw = OVar9;
        OVar9 = int_floorlog2(parameters->cblockh_init);
        poVar12[uVar18].cblkh = OVar9;
        poVar12[uVar18].cblksty = parameters->mode;
        bVar28 = parameters->irreversible == 0;
        poVar12[uVar18].qmfbid = (uint)bVar28;
        poVar12[uVar18].qntsty = (uint)!bVar28 * 2;
        poVar12[uVar18].numgbits = 2;
        iVar20 = 0;
        if (uVar18 == (uint)parameters->roi_compno) {
          iVar20 = parameters->roi_shift;
        }
        tccp = poVar12 + uVar18;
        tccp->roishift = iVar20;
        if (parameters->cp_cinema == OFF) {
          if (uVar21 == 0) {
            for (uVar14 = 0; uVar14 < uVar24; uVar14 = uVar14 + 1) {
              *(undefined4 *)((long)poVar12 + uVar14 * 4 + local_70 + -0x84) = 0xf;
              *(undefined4 *)((long)poVar12->stepsizes + uVar14 * 4 + local_70 + -0x1c) = 0xf;
            }
          }
          else {
            lVar13 = 0;
            while( true ) {
              uVar24 = uVar24 - 1;
              uVar21 = (uint)uVar24;
              if ((int)uVar21 < 0) break;
              lVar15 = (long)parameters->res_spec;
              if (lVar13 < lVar15) {
                OVar9 = 1;
                if (0 < parameters->prcw_init[lVar13]) {
                  OVar9 = int_floorlog2(parameters->prcw_init[lVar13]);
                }
                tccp->prcw[uVar21 & 0x7fffffff] = OVar9;
                iVar20 = parameters->prch_init[lVar13];
              }
              else {
                bVar16 = ((char)lVar13 - (char)parameters->res_spec) + 1;
                iVar23 = parameters->prcw_init[lVar15 + -1] >> (bVar16 & 0x1f);
                iVar20 = parameters->prcw_init[lVar15 + 0x20] >> (bVar16 & 0x1f);
                OVar9 = 1;
                if (0 < iVar23) {
                  OVar9 = int_floorlog2(iVar23);
                }
                tccp->prcw[uVar21 & 0x7fffffff] = OVar9;
              }
              OVar9 = 1;
              if (0 < iVar20) {
                OVar9 = int_floorlog2(iVar20);
              }
              tccp->prch[uVar21 & 0x7fffffff] = OVar9;
              lVar13 = lVar13 + 1;
            }
          }
        }
        else {
          tccp->prcw[0] = 7;
          tccp->prch[0] = 7;
          for (lVar13 = 0xcc; lVar13 - 0xcbU < uVar24; lVar13 = lVar13 + 1) {
            *(undefined4 *)((long)poVar12->stepsizes + lVar13 * 4 + local_68 + -0x1c) = 8;
            *(undefined4 *)((long)&poVar12->stepsizes[0xd].expn + lVar13 * 4 + local_68) = 8;
          }
        }
        dwt_calc_explicit_stepsizes(tccp,image->comps[uVar18].prec);
        uVar14 = (ulong)image->numcomps;
        local_68 = local_68 + 0x438;
        local_70 = local_70 + 0x438;
      }
      uVar24 = (ulong)(uint)poVar10->tw;
      uVar18 = (ulong)(uint)poVar10->th;
      lVar17 = lVar17 + 0x15e8;
    }
  }
  return;
}

Assistant:

void j2k_setup_encoder(opj_j2k_t *j2k, opj_cparameters_t *parameters, opj_image_t *image) {
	int i, j, tileno, numpocs_tile;
	opj_cp_t *cp = NULL;

	if(!j2k || !parameters || ! image) {
		return;
	}

	/* create and initialize the coding parameters structure */
	cp = (opj_cp_t*) opj_calloc(1, sizeof(opj_cp_t));

	/* keep a link to cp so that we can destroy it later in j2k_destroy_compress */
	j2k->cp = cp;

	/* set default values for cp */
	cp->tw = 1;
	cp->th = 1;

	/* 
	copy user encoding parameters 
	*/
	cp->cinema = parameters->cp_cinema;
	cp->max_comp_size =	parameters->max_comp_size;
	cp->rsiz   = parameters->cp_rsiz;
	cp->disto_alloc = parameters->cp_disto_alloc;
	cp->fixed_alloc = parameters->cp_fixed_alloc;
	cp->fixed_quality = parameters->cp_fixed_quality;

	/* mod fixed_quality */
	if(parameters->cp_matrice) {
		size_t array_size = parameters->tcp_numlayers * parameters->numresolution * 3 * sizeof(int);
		cp->matrice = (int *) opj_malloc(array_size);
		memcpy(cp->matrice, parameters->cp_matrice, array_size);
	}

	/* tiles */
	cp->tdx = parameters->cp_tdx;
	cp->tdy = parameters->cp_tdy;

	/* tile offset */
	cp->tx0 = parameters->cp_tx0;
	cp->ty0 = parameters->cp_ty0;

	/* comment string */
	if(parameters->cp_comment) {
		cp->comment = (char*)opj_malloc(strlen(parameters->cp_comment) + 1);
		if(cp->comment) {
			strcpy(cp->comment, parameters->cp_comment);
		}
	}

	/*
	calculate other encoding parameters
	*/

	if (parameters->tile_size_on) {
		cp->tw = int_ceildiv(image->x1 - cp->tx0, cp->tdx);
		cp->th = int_ceildiv(image->y1 - cp->ty0, cp->tdy);
	} else {
		cp->tdx = image->x1 - cp->tx0;
		cp->tdy = image->y1 - cp->ty0;
	}

	if(parameters->tp_on){
		cp->tp_flag = parameters->tp_flag;
		cp->tp_on = 1;
	}
	
	cp->img_size = 0;
	for(i=0;i<image->numcomps ;i++){
	cp->img_size += (image->comps[i].w *image->comps[i].h * image->comps[i].prec);
	}


#ifdef USE_JPWL
	/*
	calculate JPWL encoding parameters
	*/

	if (parameters->jpwl_epc_on) {
		int i;

		/* set JPWL on */
		cp->epc_on = OPJ_TRUE;
		cp->info_on = OPJ_FALSE; /* no informative technique */

		/* set EPB on */
		if ((parameters->jpwl_hprot_MH > 0) || (parameters->jpwl_hprot_TPH[0] > 0)) {
			cp->epb_on = OPJ_TRUE;
			
			cp->hprot_MH = parameters->jpwl_hprot_MH;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				cp->hprot_TPH_tileno[i] = parameters->jpwl_hprot_TPH_tileno[i];
				cp->hprot_TPH[i] = parameters->jpwl_hprot_TPH[i];
			}
			/* if tile specs are not specified, copy MH specs */
			if (cp->hprot_TPH[0] == -1) {
				cp->hprot_TPH_tileno[0] = 0;
				cp->hprot_TPH[0] = parameters->jpwl_hprot_MH;
			}
			for (i = 0; i < JPWL_MAX_NO_PACKSPECS; i++) {
				cp->pprot_tileno[i] = parameters->jpwl_pprot_tileno[i];
				cp->pprot_packno[i] = parameters->jpwl_pprot_packno[i];
				cp->pprot[i] = parameters->jpwl_pprot[i];
			}
		}

		/* set ESD writing */
		if ((parameters->jpwl_sens_size == 1) || (parameters->jpwl_sens_size == 2)) {
			cp->esd_on = OPJ_TRUE;

			cp->sens_size = parameters->jpwl_sens_size;
			cp->sens_addr = parameters->jpwl_sens_addr;
			cp->sens_range = parameters->jpwl_sens_range;

			cp->sens_MH = parameters->jpwl_sens_MH;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				cp->sens_TPH_tileno[i] = parameters->jpwl_sens_TPH_tileno[i];
				cp->sens_TPH[i] = parameters->jpwl_sens_TPH[i];
			}
		}

		/* always set RED writing to false: we are at the encoder */
		cp->red_on = OPJ_FALSE;

	} else {
		cp->epc_on = OPJ_FALSE;
	}
#endif /* USE_JPWL */


	/* initialize the mutiple tiles */
	/* ---------------------------- */
	cp->tcps = (opj_tcp_t*) opj_calloc(cp->tw * cp->th, sizeof(opj_tcp_t));

	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		opj_tcp_t *tcp = &cp->tcps[tileno];
		tcp->numlayers = parameters->tcp_numlayers;
		for (j = 0; j < tcp->numlayers; j++) {
			if(cp->cinema){
				if (cp->fixed_quality) {
					tcp->distoratio[j] = parameters->tcp_distoratio[j];
				}
				tcp->rates[j] = parameters->tcp_rates[j];
			}else{
				if (cp->fixed_quality) {	/* add fixed_quality */
					tcp->distoratio[j] = parameters->tcp_distoratio[j];
				} else {
					tcp->rates[j] = parameters->tcp_rates[j];
				}
			}
		}
		tcp->csty = parameters->csty;
		tcp->prg = parameters->prog_order;
		tcp->mct = parameters->tcp_mct; 

		numpocs_tile = 0;
		tcp->POC = 0;
		if (parameters->numpocs) {
			/* initialisation of POC */
			tcp->POC = 1;
			for (i = 0; i < parameters->numpocs; i++) {
				if((tileno == parameters->POC[i].tile - 1) || (parameters->POC[i].tile == -1)) {
					opj_poc_t *tcp_poc = &tcp->pocs[numpocs_tile];
					tcp_poc->resno0		= parameters->POC[numpocs_tile].resno0;
					tcp_poc->compno0	= parameters->POC[numpocs_tile].compno0;
					tcp_poc->layno1		= parameters->POC[numpocs_tile].layno1;
					tcp_poc->resno1		= parameters->POC[numpocs_tile].resno1;
					tcp_poc->compno1	= parameters->POC[numpocs_tile].compno1;
					tcp_poc->prg1		= parameters->POC[numpocs_tile].prg1;
					tcp_poc->tile		= parameters->POC[numpocs_tile].tile;
					numpocs_tile++;
				}
			}
			tcp->numpocs = numpocs_tile -1 ;
		}else{ 
			tcp->numpocs = 0;
		}

		tcp->tccps = (opj_tccp_t*) opj_calloc(image->numcomps, sizeof(opj_tccp_t));

		for (i = 0; i < image->numcomps; i++) {
			opj_tccp_t *tccp = &tcp->tccps[i];
			tccp->csty = parameters->csty & 0x01;	/* 0 => one precinct || 1 => custom precinct  */
			tccp->numresolutions = parameters->numresolution;
			tccp->cblkw = int_floorlog2(parameters->cblockw_init);
			tccp->cblkh = int_floorlog2(parameters->cblockh_init);
			tccp->cblksty = parameters->mode;
			tccp->qmfbid = parameters->irreversible ? 0 : 1;
			tccp->qntsty = parameters->irreversible ? J2K_CCP_QNTSTY_SEQNT : J2K_CCP_QNTSTY_NOQNT;
			tccp->numgbits = 2;
			if (i == parameters->roi_compno) {
				tccp->roishift = parameters->roi_shift;
			} else {
				tccp->roishift = 0;
			}

			if(parameters->cp_cinema)
			{
				/*Precinct size for lowest frequency subband=128*/
				tccp->prcw[0] = 7;
				tccp->prch[0] = 7;
				/*Precinct size at all other resolutions = 256*/
				for (j = 1; j < tccp->numresolutions; j++) {
					tccp->prcw[j] = 8;
					tccp->prch[j] = 8;
				}
			}else{
				if (parameters->csty & J2K_CCP_CSTY_PRT) {
					int p = 0;
					for (j = tccp->numresolutions - 1; j >= 0; j--) {
						if (p < parameters->res_spec) {
							
							if (parameters->prcw_init[p] < 1) {
								tccp->prcw[j] = 1;
							} else {
								tccp->prcw[j] = int_floorlog2(parameters->prcw_init[p]);
							}
							
							if (parameters->prch_init[p] < 1) {
								tccp->prch[j] = 1;
							}else {
								tccp->prch[j] = int_floorlog2(parameters->prch_init[p]);
							}

						} else {
							int res_spec = parameters->res_spec;
							int size_prcw = parameters->prcw_init[res_spec - 1] >> (p - (res_spec - 1));
							int size_prch = parameters->prch_init[res_spec - 1] >> (p - (res_spec - 1));
							
							if (size_prcw < 1) {
								tccp->prcw[j] = 1;
							} else {
								tccp->prcw[j] = int_floorlog2(size_prcw);
							}
							
							if (size_prch < 1) {
								tccp->prch[j] = 1;
							} else {
								tccp->prch[j] = int_floorlog2(size_prch);
							}
						}
						p++;
						/*printf("\nsize precinct for level %d : %d,%d\n", j,tccp->prcw[j], tccp->prch[j]); */
					}	/*end for*/
				} else {
					for (j = 0; j < tccp->numresolutions; j++) {
						tccp->prcw[j] = 15;
						tccp->prch[j] = 15;
					}
				}
			}

			dwt_calc_explicit_stepsizes(tccp, image->comps[i].prec);
		}
	}
}